

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O0

void __thiscall
agge::renderer::operator()
          (renderer *this,bitmap<unsigned_char,_0UL,_0UL> *bitmap_,vector_i offset,rect_i *window,
          rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,_agge::scaling<float>_>
          *mask,blender<unsigned_char,_unsigned_char> *blender,
          simple_alpha<unsigned_char,_8UL> *alpha)

{
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  *buffer;
  bool bVar1;
  uchar uVar2;
  count_t max_length;
  int iVar3;
  int iVar4;
  int area_00;
  uint count;
  scanline_cells sVar5;
  undefined1 local_170 [8];
  scanline_adapter<agge::renderer::adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>_>
  scanline;
  undefined1 local_148 [8];
  rendition_adapter ra;
  blender<unsigned_char,_unsigned_char> *blender_local;
  rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,_agge::scaling<float>_>
  *mask_local;
  rect_i *window_local;
  bitmap<unsigned_char,_0UL,_0UL> *bitmap__local;
  renderer *this_local;
  vector_i offset_local;
  scanline_cells cells;
  int limit_y;
  int y;
  int len;
  int cover_m;
  int area;
  int x;
  cell *i;
  int cover;
  cover_type *p;
  
  scanline._start_cover = (cover_type *)offset;
  ra._48_8_ = blender;
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::adapter((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
             *)local_148,bitmap_,offset,window,blender);
  max_length = vector_rasterizer::width(&mask->super_vector_rasterizer);
  scanline_adapter<agge::renderer::adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>_>
  ::scanline_adapter((scanline_adapter<agge::renderer::adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>_>
                      *)local_170,
                     (adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                      *)local_148,&this->_scanline_cache,max_length);
  cells.second._4_4_ = vector_rasterizer::min_y(&mask->super_vector_rasterizer);
  iVar3 = vector_rasterizer::min_y(&mask->super_vector_rasterizer);
  iVar4 = vector_rasterizer::height(&mask->super_vector_rasterizer);
  for (; cells.second._4_4_ < iVar3 + iVar4; cells.second._4_4_ = cells.second._4_4_ + 1) {
    sVar5 = vector_rasterizer::operator[](&mask->super_vector_rasterizer,cells.second._4_4_);
    bVar1 = scanline_adapter<agge::renderer::adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>_>
            ::begin((scanline_adapter<agge::renderer::adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>_>
                     *)local_170,cells.second._4_4_);
    if (bVar1) {
      offset_local = (vector_i)sVar5.first;
      cells.first = sVar5.second;
      i._4_4_ = 0;
      if (offset_local != (vector_i)cells.first) {
        _area = offset_local;
        while( true ) {
          cover_m = (int)*(short *)_area;
          len = 0;
          do {
            len = *(int *)((long)_area + 4) + len;
            i._4_4_ = *(short *)((long)_area + 8) + i._4_4_;
            _area = (vector_i)((long)_area + 10);
            bVar1 = false;
            if (_area != (vector_i)cells.first) {
              bVar1 = *(short *)_area == cover_m;
            }
          } while (bVar1);
          area_00 = i._4_4_ * 0x200;
          if (len != 0) {
            uVar2 = agge::tests::mocks::simple_alpha<unsigned_char,_8UL>::operator()
                              (alpha,area_00 - len);
            if (cover_m != (int)scanline._cover) {
              adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
              ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                            *)local_170,scanline._cover._4_4_,
                           (int)scanline._cover - scanline._cover._4_4_,
                           (cover_type *)scanline._16_8_);
              scanline._renderer =
                   (adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                    *)scanline._16_8_;
              scanline._cover._0_4_ = cover_m;
              scanline._cover._4_4_ = cover_m;
            }
            scanline._cover._0_4_ = (int)scanline._cover + 1;
            *(uchar *)&(scanline._renderer)->_blender = uVar2;
            cover_m = cover_m + 1;
            scanline._renderer =
                 (adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                  *)((long)&(scanline._renderer)->_blender + 1);
          }
          if (_area == (vector_i)cells.first) break;
          count = *(short *)_area - cover_m;
          if ((count != 0) && (area_00 != 0)) {
            uVar2 = agge::tests::mocks::simple_alpha<unsigned_char,_8UL>::operator()(alpha,area_00);
            if (cover_m != (int)scanline._cover) {
              adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
              ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                            *)local_170,scanline._cover._4_4_,
                           (int)scanline._cover - scanline._cover._4_4_,
                           (cover_type *)scanline._16_8_);
              scanline._cover._0_4_ = cover_m;
              scanline._cover._4_4_ = cover_m;
              scanline._renderer =
                   (adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                    *)scanline._16_8_;
            }
            buffer = scanline._renderer;
            scanline._cover._0_4_ = count + (int)scanline._cover;
            scanline._renderer =
                 (adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                  *)((long)&(scanline._renderer)->_blender + (ulong)count);
            memset<unsigned_char>((uchar *)buffer,uVar2,count);
          }
        }
      }
      adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
      ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                    *)local_170,scanline._cover._4_4_,(int)scanline._cover - scanline._cover._4_4_,
                   (cover_type *)scanline._16_8_);
      scanline._cover._0_4_ = 0;
      scanline._cover._4_4_ = 0;
      scanline._renderer =
           (adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
            *)scanline._16_8_;
    }
  }
  return;
}

Assistant:

inline void renderer::operator ()(BitmapT &bitmap_, vector_i offset, const rect_i *window, const MaskT &mask, const BlenderT &blender,
		const AlphaFn &alpha)
	{
		typedef adapter<BitmapT, BlenderT> rendition_adapter;

		rendition_adapter ra(bitmap_, offset, window, blender);
		scanline_adapter<rendition_adapter> scanline(ra, _scanline_cache, mask.width());

		render(scanline, mask, alpha, 0, 1);
	}